

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O2

void Gia_ManWriteMiniLut(Gia_Man_t *pGia,char *pFileName)

{
  int iVar1;
  int iVar2;
  Mini_Lut_t *p;
  FILE *__s;
  byte bVar3;
  
  p = Gia_ManToMiniLut(pGia);
  __s = fopen(pFileName,"wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open file for writing \"%s\".\n",pFileName);
  }
  else {
    fwrite(&p->nSize,4,1,__s);
    fwrite(&p->nRegs,4,1,__s);
    fwrite(&p->LutSize,4,1,__s);
    iVar1 = p->nSize;
    iVar2 = p->LutSize;
    fwrite(p->pArray,4,(long)(iVar2 * iVar1),__s);
    bVar3 = (char)iVar2 - 5;
    if (iVar2 < 6) {
      bVar3 = 0;
    }
    fwrite(p->pTruths,4,(long)(iVar1 << (bVar3 & 0x1f)),__s);
    fclose(__s);
  }
  Mini_LutStop(p);
  return;
}

Assistant:

void Gia_ManWriteMiniLut( Gia_Man_t * pGia, char * pFileName )
{
    Mini_Lut_t * p = Gia_ManToMiniLut( pGia );
    Mini_LutDump( p, pFileName );
    Mini_LutStop( p );
}